

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O3

adt_error_t adt_str_append_cstr(adt_str_t *self,char *cstr)

{
  adt_error_t aVar1;
  byte bVar2;
  byte bVar3;
  int s32NewLen;
  size_t __n;
  
  if (cstr == (char *)0x0 || self == (adt_str_t *)0x0) {
    return '\x01';
  }
  bVar2 = *cstr;
  if (bVar2 != 0) {
    bVar3 = 1;
    __n = 0;
    do {
      if ((bVar3 == 1) && ((char)bVar2 < '\0')) {
        bVar3 = ((bVar2 & 0xe0) == 0xc0 || ((bVar2 & 0xf0) == 0xe0 || (bVar2 & 0xf8) == 0xf0)) ^ 3;
      }
      bVar2 = cstr[__n + 1];
      __n = __n + 1;
    } while (bVar2 != 0);
    s32NewLen = self->s32Cur + (int)__n;
    aVar1 = adt_str_reserve(self,s32NewLen);
    if (aVar1 != '\0') {
      return aVar1;
    }
    if (self->s32Size <= s32NewLen) {
      __assert_fail("self->s32Size > newSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                    ,0x1ca,"adt_error_t adt_str_append_cstr(adt_str_t *, const char *)");
    }
    memcpy(self->pAlloc + self->s32Cur,cstr,__n);
    self->s32Cur = s32NewLen;
    if (bVar3 != 2) {
      return '\0';
    }
    if (self->encoding != '\x01') {
      return '\0';
    }
    self->encoding = '\x02';
  }
  return '\0';
}

Assistant:

adt_error_t adt_str_append_cstr(adt_str_t *self, const char *cstr)
{
   adt_error_t retval = ADT_NO_ERROR;
   if ( (self == 0) || (cstr == 0) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      int32_t s32Size = 0;
      adt_str_encoding_t encoding = adt_utf8_checkEncodingAndSize((const uint8_t*) cstr, 0, &s32Size);
      if ( (encoding != ADT_STR_ENCODING_UNKNOWN) && (s32Size > 0) )
      {
         adt_error_t result;
         int32_t newSize = self->s32Cur+s32Size;
         result = adt_str_reserve(self, newSize);
         if (result == ADT_NO_ERROR)
         {
            assert(self->s32Size > newSize);
            memcpy(self->pAlloc+self->s32Cur, cstr, s32Size);
            self->s32Cur = newSize;
            if ( (self->encoding == ADT_STR_ENCODING_ASCII) && (encoding == ADT_STR_ENCODING_UTF8) )
            {
               self->encoding = encoding;
            }
         }
         else
         {
            retval = result;
         }
      }
   }
   return retval;
}